

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O2

void PVG_FT_Vector_Polarize(PVG_FT_Vector *vec,PVG_FT_Fixed *length,PVG_FT_Angle *angle)

{
  PVG_FT_Int PVar1;
  PVG_FT_Fixed s;
  long lVar2;
  long lVar3;
  ulong uVar4;
  PVG_FT_Vector local_38;
  
  local_38.x = vec->x;
  local_38.y = vec->y;
  if (local_38.y != 0 || local_38.x != 0) {
    PVar1 = ft_trig_prenorm(&local_38);
    ft_trig_pseudo_polarize(&local_38);
    lVar2 = -local_38.x;
    if (0 < local_38.x) {
      lVar2 = local_38.x;
    }
    lVar3 = lVar2 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar2 = -lVar3;
    if (-1 < local_38.x) {
      lVar2 = lVar3;
    }
    uVar4 = (ulong)(uint)((int)lVar2 << (-(byte)PVar1 & 0x1f));
    if (-1 < PVar1) {
      uVar4 = lVar2 >> ((byte)PVar1 & 0x3f);
    }
    *length = uVar4;
    *angle = local_38.y;
  }
  return;
}

Assistant:

void PVG_FT_Vector_Polarize(PVG_FT_Vector* vec, PVG_FT_Fixed* length,
    PVG_FT_Angle* angle)
{
    PVG_FT_Int    shift;
    PVG_FT_Vector v;

    v = *vec;

    if (v.x == 0 && v.y == 0) return;

    shift = ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    v.x = ft_trig_downscale(v.x);

    *length = (shift >= 0) ? (v.x >> shift)
                           : (PVG_FT_Fixed)((PVG_FT_UInt32)v.x << -shift);
    *angle = v.y;
}